

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,string *name,Header *header,RgbaChannels rgbaChannels,int numThreads
          )

{
  Data *pDVar1;
  Compression *pCVar2;
  RgbaOutputFile *this_00;
  Header newHeader;
  Header local_60;
  
  this->_vptr_AcesOutputFile = (_func_int **)&PTR__AcesOutputFile_001e4bb8;
  pDVar1 = (Data *)operator_new(8);
  pDVar1->rgbaFile = (RgbaOutputFile *)0x0;
  this->_data = pDVar1;
  pCVar2 = Header::compression(header);
  anon_unknown_14::checkCompression(*pCVar2);
  Header::Header(&local_60,header);
  acesChromaticities();
  addChromaticities(&local_60,&acesChromaticities::acesChr);
  acesChromaticities();
  addAdoptedNeutral(&local_60,&acesChromaticities::acesChr.white);
  this_00 = (RgbaOutputFile *)operator_new(0x18);
  RgbaOutputFile::RgbaOutputFile(this_00,(name->_M_dataplus)._M_p,&local_60,rgbaChannels,numThreads)
  ;
  this->_data->rgbaFile = this_00;
  RgbaOutputFile::setYCRounding(this_00,7,6);
  Header::~Header(&local_60);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile (
    const std::string& name,
    const Header&      header,
    RgbaChannels       rgbaChannels,
    int                numThreads)
    : _data (new Data)
{
    checkCompression (header.compression ());

    Header newHeader = header;
    addChromaticities (newHeader, acesChromaticities ());
    addAdoptedNeutral (newHeader, acesChromaticities ().white);

    _data->rgbaFile =
        new RgbaOutputFile (name.c_str (), newHeader, rgbaChannels, numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}